

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

string * __thiscall test_get_rows_back::vars_abi_cxx11_(test_get_rows_back *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_2c0 [12];
  ggml_type in_stack_fffffffffffffd4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [48];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  var_to_str_abi_cxx11_(in_stack_fffffffffffffd4c);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>((int *)in_stack_fffffffffffffd18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>((int *)in_stack_fffffffffffffd18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>((int *)in_stack_fffffffffffffd18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>((int *)in_stack_fffffffffffffd18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<bool>(in_stack_fffffffffffffd18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  return __lhs;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR6(type, n, m, r, b, v);
    }